

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O2

void cppwinrt::
     throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[19],std::__cxx11::string,char[10]>
               (string *message,basic_string_view<char,_std::char_traits<char>_> *args,
               char (*args_1) [19],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               char (*args_3) [10])

{
  invalid_argument *this;
  
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)message,args);
  std::__cxx11::string::append((char *)message);
  std::__cxx11::string::append((string *)message);
  std::__cxx11::string::append((char *)message);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,(string *)message);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

[[noreturn]] inline void throw_invalid(std::string message, T const&... args)
    {
        (message.append(args), ...);
        throw std::invalid_argument(message);
    }